

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_0::CanonicalizationState::updateUses
          (CanonicalizationState *this,ReplacementMap *replacements,
          unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
          *info)

{
  uintptr_t uVar1;
  int *piVar2;
  int iVar3;
  anon_union_8_2_a60233d5_for_Task_2 __key;
  key_type kVar4;
  long lVar5;
  ulong uVar6;
  __node_ptr p_Var7;
  __hash_code __code;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __tmp;
  anon_union_8_2_a60233d5_for_Task_2 aVar8;
  pair<std::__detail::_Node_iterator<wasm::HeapType,_true,_true>,_bool> pVar9;
  key_type kStack_b8;
  HeapType super;
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a0;
  char local_68;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_60;
  __buckets_ptr local_58;
  HeapType root;
  undefined8 local_40;
  anon_union_8_2_a60233d5_for_Task_2 local_38;
  
  if ((this->newInfos).
      super__Vector_base<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>,_std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_58 = (replacements->_M_h)._M_buckets;
    local_a0._M_buckets = &local_a0._M_single_bucket;
    kStack_b8.id = 0;
    super.id = 0;
    local_a0._M_bucket_count = 1;
    local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a0._M_element_count = 0;
    local_a0._M_rehash_policy._M_max_load_factor = 1.0;
    local_a0._M_rehash_policy._M_next_resize = 0;
    local_a0._M_single_bucket = (__node_base_ptr)0x0;
    local_68 = '\x01';
    local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)CONCAT44(local_40._4_4_,3);
    local_38.type = (Type *)&local_58;
    local_60 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this;
    root.id = (uintptr_t)replacements;
    std::
    vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
    ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                 *)&stack0xffffffffffffff48,(value_type *)&local_40);
    if (kStack_b8.id != super.id) {
      do {
        uVar1 = super.id - 0x10;
        piVar2 = (int *)(super.id - 0x10);
        __key = (anon_union_8_2_a60233d5_for_Task_2)
                ((anon_union_8_2_a60233d5_for_Task_2 *)(super.id - 8))->type;
        super.id = uVar1;
        if (*piVar2 == 3) {
          local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)CONCAT44(local_40._4_4_,5);
          local_38 = __key;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
          ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                       *)&stack0xffffffffffffff48,(value_type *)&local_40);
          if (local_68 == '\x01') {
            local_40 = &local_a0;
            pVar9 = std::
                    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    ::
                    _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                *)local_40,__key.type,(value_type *)&local_40);
            if ((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (kVar4.id = *(uintptr_t *)__key, 0xd < kVar4.id)) {
              iVar3 = *(int *)(kVar4.id + 0x20);
              if (iVar3 == 3) {
                local_38.type = (Type *)(kVar4.id + 0x28);
                local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)CONCAT44(local_40._4_4_,2);
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&stack0xffffffffffffff48,(value_type *)&local_40);
              }
              else if (iVar3 == 2) {
                aVar8 = (anon_union_8_2_a60233d5_for_Task_2)
                        ((anon_union_8_2_a60233d5_for_Task_2 *)(kVar4.id + 0x30))->type;
                while (aVar8.type != *(Type **)(kVar4.id + 0x28)) {
                  aVar8.type = aVar8.type + -2;
                  local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)CONCAT44(local_40._4_4_,2);
                  local_38.type = aVar8.type;
                  std::
                  vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                  ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                               *)&stack0xffffffffffffff48,(value_type *)&local_40);
                }
              }
              else if (iVar3 == 1) {
                local_38.type = (Type *)(kVar4.id + 0x30);
                local_40._0_4_ = ScanType;
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&stack0xffffffffffffff48,(value_type *)&local_40);
                local_38.type = (Type *)(kVar4.id + 0x28);
                local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)CONCAT44(local_40._4_4_,2);
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&stack0xffffffffffffff48,(value_type *)&local_40);
              }
            }
          }
          else {
            p_Var7 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::_M_find_node(local_60,(__key.type)->id % local_60->_M_bucket_count,
                                    (key_type *)__key.type,(__key.type)->id);
            if (p_Var7 != (__node_ptr)0x0) {
              (__key.type)->id =
                   *(uintptr_t *)
                    ((long)&(p_Var7->
                            super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>
                            ._M_storage._M_storage + 8);
            }
          }
          local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)CONCAT44(local_40._4_4_,1);
          local_38 = __key;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
          ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                       *)&stack0xffffffffffffff48,(value_type *)&local_40);
        }
        else if (*piVar2 == 2) {
          local_40._0_4_ = PostType;
          local_38 = __key;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
          ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                       *)&stack0xffffffffffffff48,(value_type *)&local_40);
          local_68 = '\0';
          kVar4.id = *(uintptr_t *)__key;
          if (6 < kVar4.id) {
            if (*(int *)(kVar4.id + 4) == 1) {
              local_38.type = (Type *)(kVar4.id + 8);
              local_40._0_4_ = ScanHeapType;
              std::
              vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
              ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                           *)&stack0xffffffffffffff48,(value_type *)&local_40);
            }
            else if (*(int *)(kVar4.id + 4) == 0) {
              aVar8 = (anon_union_8_2_a60233d5_for_Task_2)
                      ((anon_union_8_2_a60233d5_for_Task_2 *)(kVar4.id + 0x10))->type;
              while (aVar8.type != *(Type **)(kVar4.id + 8)) {
                aVar8.type = aVar8.type + -1;
                local_40._0_4_ = ScanType;
                local_38.type = aVar8.type;
                std::
                vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                             *)&stack0xffffffffffffff48,(value_type *)&local_40);
              }
            }
          }
          local_40 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)((ulong)local_40._4_4_ << 0x20);
          local_38 = __key;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
          ::push_back((vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<ChildUpdater>::Task>_>
                       *)&stack0xffffffffffffff48,(value_type *)&local_40);
        }
      } while (kStack_b8.id != super.id);
    }
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_a0);
    if ((pointer)kStack_b8.id != (pointer)0x0) {
      operator_delete((void *)kStack_b8.id,-kStack_b8.id);
    }
    lVar5 = *(long *)root.id;
    kStack_b8.id = *(ulong *)(lVar5 + 8);
    if (((pointer)kStack_b8.id != (pointer)0x0) &&
       (p_Var7 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_node((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)this,kStack_b8.id %
                                        (ulong)(this->results).
                                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                               ._M_impl.super__Vector_impl_data._M_finish,
                                &stack0xffffffffffffff48,kStack_b8.id), p_Var7 != (__node_ptr)0x0))
    {
      uVar6 = *(ulong *)((long)&(p_Var7->
                                super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::(anonymous_namespace)::CanonicalizationState::Replacement>_>
                                ._M_storage._M_storage + 8);
      if (uVar6 < 0xe) {
        __assert_fail("!ht.isBasic()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                      ,0x1bc,"HeapTypeInfo *wasm::(anonymous namespace)::getHeapTypeInfo(HeapType)")
        ;
      }
      *(ulong *)(lVar5 + 8) = uVar6;
    }
  }
  return;
}

Assistant:

void CanonicalizationState::updateUses(ReplacementMap& replacements,
                                       std::unique_ptr<HeapTypeInfo>& info) {
  if (replacements.empty()) {
    return;
  }
  // Replace all old types reachable from `info`.
  struct ChildUpdater : HeapTypeChildWalker<ChildUpdater> {
    ReplacementMap& replacements;
    ChildUpdater(ReplacementMap& replacements) : replacements(replacements) {}
    void noteChild(HeapType* child) {
      if (auto it = replacements.find(*child); it != replacements.end()) {
        *child = it->second.getAsHeapType();
      }
    }
  };
  HeapType root = asHeapType(info);
  ChildUpdater(replacements).walkRoot(&root);

  // We may need to update its supertype as well.
  if (info->supertype) {
    HeapType super(uintptr_t(info->supertype));
    if (auto it = replacements.find(super); it != replacements.end()) {
      info->supertype = getHeapTypeInfo(it->second.getAsHeapType());
    }
  }
}